

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamReadGroupDictionary.cpp
# Opt level: O0

void __thiscall
BamTools::SamReadGroupDictionary::Add(SamReadGroupDictionary *this,SamReadGroup *readGroup)

{
  bool bVar1;
  size_type sVar2;
  mapped_type_conflict mVar3;
  mapped_type_conflict *pmVar4;
  vector<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_> *in_RSI;
  value_type *in_RDI;
  SamReadGroup *in_stack_ffffffffffffffd8;
  SamReadGroupDictionary *in_stack_ffffffffffffffe0;
  
  bVar1 = IsEmpty((SamReadGroupDictionary *)0x190e0d);
  if ((!bVar1) && (bVar1 = Contains(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8), bVar1)) {
    return;
  }
  std::vector<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>::push_back
            (in_RSI,in_RDI);
  sVar2 = std::vector<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>::size
                    ((vector<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_> *)
                     in_RDI);
  mVar3 = sVar2 - 1;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         *)this,(key_type *)readGroup);
  *pmVar4 = mVar3;
  return;
}

Assistant:

void SamReadGroupDictionary::Add(const SamReadGroup& readGroup)
{
    if (IsEmpty() || !Contains(readGroup)) {
        m_data.push_back(readGroup);
        m_lookupData[readGroup.ID] = m_data.size() - 1;
    }
}